

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcTiming.c
# Opt level: O0

float * Abc_NtkGetCiArrivalFloats(Abc_Ntk_t *pNtk)

{
  int iVar1;
  float *pfVar2;
  Abc_Obj_t *pNode_00;
  float fVar3;
  int local_2c;
  int i;
  Abc_Obj_t *pNode;
  float *p;
  Abc_Ntk_t *pNtk_local;
  
  iVar1 = Abc_NtkCiNum(pNtk);
  pfVar2 = (float *)calloc((long)iVar1,4);
  if (pNtk->pManTime != (Abc_ManTime_t *)0x0) {
    for (local_2c = 0; iVar1 = Abc_NtkCiNum(pNtk), local_2c < iVar1; local_2c = local_2c + 1) {
      pNode_00 = Abc_NtkCi(pNtk,local_2c);
      fVar3 = Abc_NodeReadArrivalWorst(pNode_00);
      pfVar2[local_2c] = fVar3;
    }
  }
  return pfVar2;
}

Assistant:

float * Abc_NtkGetCiArrivalFloats( Abc_Ntk_t * pNtk )
{
    float * p;
    Abc_Obj_t * pNode;
    int i;
    p = ABC_CALLOC( float, Abc_NtkCiNum(pNtk) );
    if ( pNtk->pManTime == NULL )
        return p;
    // set the PI arrival times
    Abc_NtkForEachCi( pNtk, pNode, i )
        p[i] = Abc_NodeReadArrivalWorst(pNode);
    return p;
}